

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ButtonBehavior
               (ImRect *bb,ImGuiID id,bool *out_hovered,bool *out_held,ImGuiButtonFlags flags)

{
  ImVec2 IVar1;
  ImGuiID IVar2;
  ImGuiMouseButton button;
  ImGuiWindow *window;
  ImGuiWindow *pIVar3;
  bool bVar4;
  ImVec2 IVar5;
  float t1;
  ImGuiContext *pIVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  ImGuiKeyData *pIVar11;
  ImGuiKeyData *pIVar12;
  uint uVar13;
  byte bVar14;
  long lVar15;
  ImGuiContext *g;
  bool bVar16;
  bool bVar17;
  uint uVar18;
  ImGuiID local_5c;
  
  pIVar6 = GImGui;
  GImGui->CurrentWindow->WriteAccessed = true;
  window = pIVar6->CurrentWindow;
  pIVar3 = pIVar6->HoveredWindow;
  bVar16 = (flags & 7U) == 0;
  uVar13 = (uint)bVar16 + flags + 0x20;
  if ((flags & 0x3f0U) != 0) {
    uVar13 = (uint)bVar16 | flags;
  }
  if ((pIVar3 == (ImGuiWindow *)0x0 || (uVar13 >> 0xb & 1) == 0) || (pIVar3->RootWindow != window))
  {
    bVar16 = false;
  }
  else {
    pIVar6->HoveredWindow = window;
    bVar16 = true;
  }
  bVar7 = ItemHoverable(bb,id);
  if (bVar7) {
    bVar14 = 1;
    if (((pIVar6->DragDropActive & 1U) != 0) && ((pIVar6->DragDropPayload).SourceId == id)) {
      bVar14 = ((byte)pIVar6->DragDropSourceFlags & 2) >> 1;
    }
  }
  else {
    bVar14 = 0;
  }
  if ((((uVar13 >> 9 & 1) == 0 || (~pIVar6->DragDropActive & 1U) != 0) ||
      ((pIVar6->DragDropSourceFlags & 4) != 0)) || (bVar7 = IsItemHovered(0x80), !bVar7)) {
    bVar7 = false;
  }
  else {
    SetHoveredID(id);
    bVar7 = false;
    bVar14 = 1;
    if ((0.7 <= pIVar6->HoveredIdTimer) && (pIVar6->HoveredIdTimer - (pIVar6->IO).DeltaTime <= 0.7))
    {
      pIVar6->DragDropHoldJustPressedId = id;
      FocusWindow(window);
      bVar14 = 1;
      bVar7 = true;
    }
  }
  if (bVar16) {
    pIVar6->HoveredWindow = pIVar3;
  }
  if (bVar14 == 1 && (uVar13 >> 0xc & 1) != 0) {
    bVar16 = false;
    local_5c = 0;
    if ((uVar13 >> 0x15 & 1) == 0) {
      local_5c = id;
    }
    if (pIVar6->HoveredIdPreviousFrame == 0 || pIVar6->HoveredIdPreviousFrame == id) {
LAB_001ec9de:
      if (((uVar13 >> 0x10 & 1) == 0) ||
         ((((pIVar6->IO).KeyCtrl == false && ((pIVar6->IO).KeyShift == false)) &&
          ((pIVar6->IO).KeyAlt == false)))) {
        if ((uVar13 & 1) == 0) {
LAB_001eca07:
          if ((uVar13 & 2) != 0) {
            lVar15 = 1;
            bVar16 = IsMouseClicked(1,local_5c,0);
            if (bVar16) goto LAB_001eca4b;
          }
          if ((uVar13 & 4) != 0) {
            lVar15 = 2;
            bVar16 = IsMouseClicked(2,local_5c,0);
            if (bVar16) goto LAB_001eca4b;
          }
        }
        else {
          lVar15 = 0;
          bVar16 = IsMouseClicked(0,local_5c,0);
          if (!bVar16) goto LAB_001eca07;
LAB_001eca4b:
          if (pIVar6->ActiveId != id) {
            iVar10 = (int)lVar15;
            if ((uVar13 >> 0x14 & 1) == 0) {
              SetKeyOwner(iVar10 + ImGuiKey_MouseLeft,id,0);
            }
            if ((uVar13 & 0x60) != 0) {
              SetActiveID(id,window);
              pIVar6->ActiveIdMouseButton = iVar10;
              if ((uVar13 >> 0x12 & 1) == 0) {
                SetFocusID(id,window);
              }
              FocusWindow(window);
            }
            if (((uVar13 & 0x10) != 0) ||
               (((uVar13 >> 8 & 1) != 0 && ((pIVar6->IO).MouseClickedCount[lVar15] == 2)))) {
              if ((uVar13 >> 0x11 & 1) == 0) {
                SetActiveID(id,window);
              }
              else {
                ClearActiveID();
              }
              if ((uVar13 >> 0x12 & 1) == 0) {
                SetFocusID(id,window);
              }
              pIVar6->ActiveIdMouseButton = iVar10;
              FocusWindow(window);
              bVar7 = true;
            }
          }
        }
        if ((char)(byte)uVar13 < '\0') {
          if ((uVar13 & 1) == 0) {
LAB_001ecb70:
            if (((uVar13 & 2) == 0) || (bVar16 = IsMouseReleased(1,local_5c), !bVar16)) {
              if (((uVar13 & 4) == 0) || (bVar16 = IsMouseReleased(2,local_5c), !bVar16))
              goto LAB_001ecbf0;
              lVar15 = 2;
            }
            else {
              lVar15 = 1;
            }
          }
          else {
            lVar15 = 0;
            bVar16 = IsMouseReleased(0,local_5c);
            if (!bVar16) goto LAB_001ecb70;
          }
          bVar16 = true;
          if (((uVar13 >> 10 & 1) != 0) &&
             (bVar16 = bVar7,
             (pIVar6->IO).MouseDownDurationPrev[lVar15] < (pIVar6->IO).KeyRepeatDelay)) {
            bVar16 = true;
          }
          if ((uVar13 >> 0x12 & 1) == 0) {
            SetFocusID(id,window);
          }
          ClearActiveID();
          bVar7 = bVar16;
        }
LAB_001ecbf0:
        if (((((uVar13 >> 10 & 1) != 0) && (pIVar6->ActiveId == id)) &&
            (0.0 < (pIVar6->IO).MouseDownDuration[pIVar6->ActiveIdMouseButton])) &&
           (bVar16 = IsMouseClicked(pIVar6->ActiveIdMouseButton,local_5c,1), bVar16)) {
          bVar7 = true;
        }
      }
      bVar16 = true;
      if (bVar7) {
        pIVar6->NavDisableHighlight = true;
      }
    }
  }
  else {
    bVar16 = false;
    local_5c = 0;
    if ((uVar13 >> 0x15 & 1) == 0) {
      local_5c = id;
    }
    if (bVar14 != 0) goto LAB_001ec9de;
  }
  if (((pIVar6->NavId == id) && (pIVar6->NavDisableHighlight == false)) &&
     (pIVar6->NavDisableMouseHover == true)) {
    IVar2 = pIVar6->ActiveId;
    if (IVar2 == id || IVar2 == 0) {
      if ((uVar13 >> 0x13 & 1) == 0) {
LAB_001ecc92:
        bVar16 = true;
      }
    }
    else if (((uVar13 >> 0x13 & 1) == 0) && (IVar2 == window->MoveId)) goto LAB_001ecc92;
  }
  if (pIVar6->NavActivateDownId == id) {
    IVar2 = pIVar6->NavActivateId;
    bVar17 = pIVar6->NavActivatePressedId == id;
    if ((uVar13 >> 10 & 1) != 0 && !bVar17) {
      pIVar11 = GetKeyData(ImGuiKey_Space);
      pIVar12 = GetKeyData(ImGuiKey_GamepadFaceDown);
      uVar18 = -(uint)(pIVar12->DownDuration <= pIVar11->DownDuration);
      t1 = (float)(~uVar18 & (uint)pIVar12->DownDuration | (uint)pIVar11->DownDuration & uVar18);
      iVar10 = CalcTypematicRepeatAmount
                         (t1 - (pIVar6->IO).DeltaTime,t1,(pIVar6->IO).KeyRepeatDelay,
                          (pIVar6->IO).KeyRepeatRate);
      bVar17 = 0 < iVar10;
    }
    if ((IVar2 == id) || (bVar17)) {
      SetActiveID(id,window);
      pIVar6->ActiveIdSource = ImGuiInputSource_Nav;
      bVar7 = true;
      if ((uVar13 >> 0x12 & 1) == 0) {
        SetFocusID(id,window);
        bVar7 = true;
      }
    }
  }
  if (pIVar6->ActiveId != id) {
    bVar17 = false;
    goto LAB_001ecebc;
  }
  if (pIVar6->ActiveIdSource == ImGuiInputSource_Nav) {
    if (pIVar6->NavActivateDownId != id) {
      ClearActiveID();
    }
LAB_001ece2c:
    bVar17 = false;
  }
  else {
    if (pIVar6->ActiveIdSource != ImGuiInputSource_Mouse) goto LAB_001ece2c;
    if (pIVar6->ActiveIdIsJustActivated == true) {
      IVar1 = (pIVar6->IO).MousePos;
      IVar5.y = IVar1.y - (bb->Min).y;
      IVar5.x = IVar1.x - (bb->Min).x;
      pIVar6->ActiveIdClickOffset = IVar5;
    }
    button = pIVar6->ActiveIdMouseButton;
    bVar8 = IsMouseDown(button,local_5c);
    bVar17 = true;
    if (!bVar8) {
      bVar17 = bVar7;
      if ((((uVar13 & 0x40) != 0) || (((byte)uVar13 >> 5 & bVar16) != 0)) &&
         (pIVar6->DragDropActive == false)) {
        if (((uVar13 >> 8 & 1) == 0) || ((pIVar6->IO).MouseReleased[button] != true)) {
          bVar8 = false;
        }
        else {
          bVar8 = (pIVar6->IO).MouseClickedLastCount[button] == 2;
        }
        if ((uVar13 >> 10 & 1) == 0) {
          bVar4 = false;
        }
        else {
          bVar4 = (pIVar6->IO).KeyRepeatDelay <= (pIVar6->IO).MouseDownDurationPrev[button];
        }
        bVar9 = TestKeyOwner(button + ImGuiKey_MouseLeft,local_5c);
        bVar17 = true;
        if (!bVar9) {
          bVar17 = bVar7;
        }
        if ((bool)(bVar8 | bVar4)) {
          bVar17 = bVar7;
        }
      }
      bVar7 = bVar17;
      ClearActiveID();
      bVar17 = false;
    }
    if ((uVar13 >> 0x12 & 1) == 0) {
      pIVar6->NavDisableHighlight = true;
    }
  }
  if (bVar7 != false) {
    pIVar6->ActiveIdHasBeenPressedBefore = true;
  }
LAB_001ecebc:
  if (out_hovered != (bool *)0x0) {
    *out_hovered = bVar16;
  }
  if (out_held != (bool *)0x0) {
    *out_held = bVar17;
  }
  return bVar7;
}

Assistant:

bool ImGui::ButtonBehavior(const ImRect& bb, ImGuiID id, bool* out_hovered, bool* out_held, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    // Default only reacts to left mouse button
    if ((flags & ImGuiButtonFlags_MouseButtonMask_) == 0)
        flags |= ImGuiButtonFlags_MouseButtonDefault_;

    // Default behavior requires click + release inside bounding box
    if ((flags & ImGuiButtonFlags_PressedOnMask_) == 0)
        flags |= ImGuiButtonFlags_PressedOnDefault_;

    ImGuiWindow* backup_hovered_window = g.HoveredWindow;
    const bool flatten_hovered_children = (flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredWindow && g.HoveredWindow->RootWindow == window;
    if (flatten_hovered_children)
        g.HoveredWindow = window;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0 && g.LastItemData.ID != id)
        IMGUI_TEST_ENGINE_ITEM_ADD(bb, id);
#endif

    bool pressed = false;
    bool hovered = ItemHoverable(bb, id);

    // Drag source doesn't report as hovered
    if (hovered && g.DragDropActive && g.DragDropPayload.SourceId == id && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoDisableHover))
        hovered = false;

    // Special mode for Drag and Drop where holding button pressed for a long time while dragging another item triggers the button
    if (g.DragDropActive && (flags & ImGuiButtonFlags_PressedOnDragDropHold) && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoHoldToOpenOthers))
        if (IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        {
            hovered = true;
            SetHoveredID(id);
            if (g.HoveredIdTimer - g.IO.DeltaTime <= DRAGDROP_HOLD_TO_OPEN_TIMER && g.HoveredIdTimer >= DRAGDROP_HOLD_TO_OPEN_TIMER)
            {
                pressed = true;
                g.DragDropHoldJustPressedId = id;
                FocusWindow(window);
            }
        }

    if (flatten_hovered_children)
        g.HoveredWindow = backup_hovered_window;

    // AllowOverlap mode (rarely used) requires previous frame HoveredId to be null or to match. This allows using patterns where a later submitted widget overlaps a previous one.
    if (hovered && (flags & ImGuiButtonFlags_AllowItemOverlap) && (g.HoveredIdPreviousFrame != id && g.HoveredIdPreviousFrame != 0))
        hovered = false;

    // Mouse handling
    const ImGuiID test_owner_id = (flags & ImGuiButtonFlags_NoTestKeyOwner) ? ImGuiKeyOwner_Any : id;
    if (hovered)
    {
        if (!(flags & ImGuiButtonFlags_NoKeyModifiers) || (!g.IO.KeyCtrl && !g.IO.KeyShift && !g.IO.KeyAlt))
        {
            // Poll buttons
            int mouse_button_clicked = -1;
            if ((flags & ImGuiButtonFlags_MouseButtonLeft) && IsMouseClicked(0, test_owner_id))         { mouse_button_clicked = 0; }
            else if ((flags & ImGuiButtonFlags_MouseButtonRight) && IsMouseClicked(1, test_owner_id))   { mouse_button_clicked = 1; }
            else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && IsMouseClicked(2, test_owner_id))  { mouse_button_clicked = 2; }
            if (mouse_button_clicked != -1 && g.ActiveId != id)
            {
                if (!(flags & ImGuiButtonFlags_NoSetKeyOwner))
                    SetKeyOwner(MouseButtonToKey(mouse_button_clicked), id);
                if (flags & (ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnClickReleaseAnywhere))
                {
                    SetActiveID(id, window);
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    if (!(flags & ImGuiButtonFlags_NoNavFocus))
                        SetFocusID(id, window);
                    FocusWindow(window);
                }
                if ((flags & ImGuiButtonFlags_PressedOnClick) || ((flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseClickedCount[mouse_button_clicked] == 2))
                {
                    pressed = true;
                    if (flags & ImGuiButtonFlags_NoHoldingActiveId)
                        ClearActiveID();
                    else
                        SetActiveID(id, window); // Hold on ID
                    if (!(flags & ImGuiButtonFlags_NoNavFocus))
                        SetFocusID(id, window);
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    FocusWindow(window);
                }
            }
            if (flags & ImGuiButtonFlags_PressedOnRelease)
            {
                int mouse_button_released = -1;
                if ((flags & ImGuiButtonFlags_MouseButtonLeft) && IsMouseReleased(0, test_owner_id))        { mouse_button_released = 0; }
                else if ((flags & ImGuiButtonFlags_MouseButtonRight) && IsMouseReleased(1, test_owner_id))  { mouse_button_released = 1; }
                else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && IsMouseReleased(2, test_owner_id)) { mouse_button_released = 2; }
                if (mouse_button_released != -1)
                {
                    const bool has_repeated_at_least_once = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button_released] >= g.IO.KeyRepeatDelay; // Repeat mode trumps on release behavior
                    if (!has_repeated_at_least_once)
                        pressed = true;
                    if (!(flags & ImGuiButtonFlags_NoNavFocus))
                        SetFocusID(id, window);
                    ClearActiveID();
                }
            }

            // 'Repeat' mode acts when held regardless of _PressedOn flags (see table above).
            // Relies on repeat logic of IsMouseClicked() but we may as well do it ourselves if we end up exposing finer RepeatDelay/RepeatRate settings.
            if (g.ActiveId == id && (flags & ImGuiButtonFlags_Repeat))
                if (g.IO.MouseDownDuration[g.ActiveIdMouseButton] > 0.0f && IsMouseClicked(g.ActiveIdMouseButton, test_owner_id, ImGuiInputFlags_Repeat))
                    pressed = true;
        }

        if (pressed)
            g.NavDisableHighlight = true;
    }

    // Gamepad/Keyboard navigation
    // We report navigated item as hovered but we don't set g.HoveredId to not interfere with mouse.
    if (g.NavId == id && !g.NavDisableHighlight && g.NavDisableMouseHover && (g.ActiveId == 0 || g.ActiveId == id || g.ActiveId == window->MoveId))
        if (!(flags & ImGuiButtonFlags_NoHoveredOnFocus))
            hovered = true;
    if (g.NavActivateDownId == id)
    {
        bool nav_activated_by_code = (g.NavActivateId == id);
        bool nav_activated_by_inputs = (g.NavActivatePressedId == id);
        if (!nav_activated_by_inputs && (flags & ImGuiButtonFlags_Repeat))
        {
            // Avoid pressing both keys from triggering double amount of repeat events
            const ImGuiKeyData* key1 = GetKeyData(ImGuiKey_Space);
            const ImGuiKeyData* key2 = GetKeyData(ImGuiKey_NavGamepadActivate);
            const float t1 = ImMax(key1->DownDuration, key2->DownDuration);
            nav_activated_by_inputs = CalcTypematicRepeatAmount(t1 - g.IO.DeltaTime, t1, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate) > 0;
        }
        if (nav_activated_by_code || nav_activated_by_inputs)
        {
            // Set active id so it can be queried by user via IsItemActive(), equivalent of holding the mouse button.
            pressed = true;
            SetActiveID(id, window);
            g.ActiveIdSource = ImGuiInputSource_Nav;
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                SetFocusID(id, window);
        }
    }

    // Process while held
    bool held = false;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (g.ActiveIdIsJustActivated)
                g.ActiveIdClickOffset = g.IO.MousePos - bb.Min;

            const int mouse_button = g.ActiveIdMouseButton;
            if (IsMouseDown(mouse_button, test_owner_id))
            {
                held = true;
            }
            else
            {
                bool release_in = hovered && (flags & ImGuiButtonFlags_PressedOnClickRelease) != 0;
                bool release_anywhere = (flags & ImGuiButtonFlags_PressedOnClickReleaseAnywhere) != 0;
                if ((release_in || release_anywhere) && !g.DragDropActive)
                {
                    // Report as pressed when releasing the mouse (this is the most common path)
                    bool is_double_click_release = (flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseReleased[mouse_button] && g.IO.MouseClickedLastCount[mouse_button] == 2;
                    bool is_repeating_already = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button] >= g.IO.KeyRepeatDelay; // Repeat mode trumps <on release>
                    bool is_button_avail_or_owned = TestKeyOwner(MouseButtonToKey(mouse_button), test_owner_id);
                    if (!is_double_click_release && !is_repeating_already && is_button_avail_or_owned)
                        pressed = true;
                }
                ClearActiveID();
            }
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                g.NavDisableHighlight = true;
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            // When activated using Nav, we hold on the ActiveID until activation button is released
            if (g.NavActivateDownId != id)
                ClearActiveID();
        }
        if (pressed)
            g.ActiveIdHasBeenPressedBefore = true;
    }

    if (out_hovered) *out_hovered = hovered;
    if (out_held) *out_held = held;

    return pressed;
}